

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::concat<kj::String,kj::FixedArray<char,1ul>>
          (String *__return_storage_ptr__,_ *this,String *params,FixedArray<char,_1UL> *params_1)

{
  void *__src;
  void *pvVar1;
  char *__dest;
  
  heapString(__return_storage_ptr__,*(long *)(this + 8) + (ulong)(*(long *)(this + 8) == 0));
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  __src = *(void **)this;
  pvVar1 = (void *)((long)__src + *(long *)(this + 8) + -1);
  if (*(long *)(this + 8) == 0) {
    pvVar1 = (void *)0x0;
    __src = (void *)0x0;
  }
  if (__src != pvVar1) {
    memcpy(__dest,__src,(long)pvVar1 - (long)__src);
    __dest = __dest + ((long)pvVar1 - (long)__src);
  }
  *__dest = *(char *)&(params->content).ptr;
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}